

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_TwoSetsOfIdenticalSequences_Test::
~TEST_DoublingFactorCounterTest_TwoSetsOfIdenticalSequences_Test
          (TEST_DoublingFactorCounterTest_TwoSetsOfIdenticalSequences_Test *this)

{
  TEST_DoublingFactorCounterTest_TwoSetsOfIdenticalSequences_Test *mem;
  TEST_DoublingFactorCounterTest_TwoSetsOfIdenticalSequences_Test *this_local;
  
  mem = this;
  ~TEST_DoublingFactorCounterTest_TwoSetsOfIdenticalSequences_Test(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, TwoSetsOfIdenticalSequences)
{
	addPair(Tile::WhiteDragon);
	addSequence(Tile::TwoOfCharacters, false);
	addSequence(Tile::TwoOfCharacters, false);
	addSequence(Tile::ThreeOfCircles, false);
	addSequence(Tile::ThreeOfCircles, false);

	s.winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::TwoSetsOfIdenticalSequences));
	CHECK_EQUAL(0, r.patterns.count(Pattern::SevenPairs));
	CHECK_EQUAL(3, r.doubling_factor);
}